

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O0

void Fl::background(uchar r,uchar g,uchar b)

{
  Fl_Color i_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double gray;
  int i;
  double powb;
  double powg;
  double powr;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  
  fl_bg_set = '\x01';
  if (r == '\0') {
    powr._7_1_ = 1;
  }
  else {
    powr._7_1_ = r;
    if (r == 0xff) {
      powr._7_1_ = 0xfe;
    }
  }
  dVar1 = log((double)powr._7_1_ / 255.0);
  dVar2 = log(0.7391304347826086);
  if (g == '\0') {
    powr._6_1_ = 1;
  }
  else {
    powr._6_1_ = g;
    if (g == 0xff) {
      powr._6_1_ = 0xfe;
    }
  }
  dVar3 = log((double)powr._6_1_ / 255.0);
  dVar4 = log(0.7391304347826086);
  if (b == '\0') {
    powr._5_1_ = 1;
  }
  else {
    powr._5_1_ = b;
    if (b == 0xff) {
      powr._5_1_ = 0xfe;
    }
  }
  dVar5 = log((double)powr._5_1_ / 255.0);
  dVar6 = log(0.7391304347826086);
  for (gray._4_4_ = 0; gray._4_4_ < 0x18; gray._4_4_ = gray._4_4_ + 1) {
    dVar7 = (double)gray._4_4_ / 23.0;
    i_00 = fl_gray_ramp(gray._4_4_);
    dVar8 = pow(dVar7,dVar1 / dVar2);
    dVar9 = pow(dVar7,dVar3 / dVar4);
    dVar7 = pow(dVar7,dVar5 / dVar6);
    set_color(i_00,(uchar)(int)(dVar8 * 255.0 + 0.5),(uchar)(int)(dVar9 * 255.0 + 0.5),
              (uchar)(int)(dVar7 * 255.0 + 0.5));
  }
  return;
}

Assistant:

void Fl::background(uchar r, uchar g, uchar b) {
  fl_bg_set = 1;

  // replace the gray ramp so that FL_GRAY is this color
  if (!r) r = 1; else if (r==255) r = 254;
  double powr = log(r/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!g) g = 1; else if (g==255) g = 254;
  double powg = log(g/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  if (!b) b = 1; else if (b==255) b = 254;
  double powb = log(b/255.0)/log((FL_GRAY-FL_GRAY_RAMP)/(FL_NUM_GRAY-1.0));
  for (int i = 0; i < FL_NUM_GRAY; i++) {
    double gray = i/(FL_NUM_GRAY-1.0);
    Fl::set_color(fl_gray_ramp(i),
		  uchar(pow(gray,powr)*255+.5),
		  uchar(pow(gray,powg)*255+.5),
		  uchar(pow(gray,powb)*255+.5));
  }
}